

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nvector.c
# Opt level: O0

int Test_N_VCloneEmpty(N_Vector W,int myid)

{
  int iVar1;
  N_Vector X_00;
  double dVar2;
  double dVar3;
  N_Vector X;
  double maxt;
  double stop_time;
  double start_time;
  int myid_local;
  N_Vector W_local;
  
  dVar2 = get_time();
  X_00 = N_VCloneEmpty(W);
  dVar3 = get_time();
  if (X_00 == (N_Vector)0x0) {
    printf(">>> FAILED test -- N_VCloneEmpty, Proc %d \n",(ulong)(uint)myid);
    printf("    After N_VCloneEmpty, X == NULL \n\n");
    W_local._4_4_ = 1;
  }
  else {
    iVar1 = has_data(X_00);
    if (iVar1 == 0) {
      N_VDestroy(X_00);
      if (myid == 0) {
        printf("PASSED test -- N_VCloneEmpty \n");
      }
      dVar2 = max_time(W,dVar3 - dVar2);
      if (print_time != 0) {
        printf("%s Time: %22.15e\n\n",dVar2,"N_VCloneEmpty");
      }
      W_local._4_4_ = 0;
    }
    else {
      printf(">>> FAILED test -- N_VCloneEmpty, Proc %d \n",(ulong)(uint)myid);
      printf("    Vector data != NULL \n\n");
      N_VDestroy(X_00);
      W_local._4_4_ = 1;
    }
  }
  return W_local._4_4_;
}

Assistant:

int Test_N_VCloneEmpty(N_Vector W, int myid)
{
  double   start_time, stop_time, maxt;
  N_Vector X;

  /* clone empty vector */
  start_time = get_time();
  X = N_VCloneEmpty(W);
  stop_time = get_time();

  /* check vector */
  if (X == NULL) {
    printf(">>> FAILED test -- N_VCloneEmpty, Proc %d \n", myid);
    printf("    After N_VCloneEmpty, X == NULL \n\n");
    return(1);
  }

  /* check vector data */
  if (has_data(X)) {
    printf(">>> FAILED test -- N_VCloneEmpty, Proc %d \n", myid);
    printf("    Vector data != NULL \n\n");
    N_VDestroy(X);
    return(1);
  }

  N_VDestroy(X);

  if (myid == 0)
    printf("PASSED test -- N_VCloneEmpty \n");
  
  /* find max time across all processes */
  maxt = max_time(W, stop_time - start_time);
  PRINT_TIME("N_VCloneEmpty", maxt);

  return(0);
}